

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_opt.cpp
# Opt level: O2

integral_image * create_padded_integral_img(int width,int height)

{
  int iVar1;
  integral_image *piVar2;
  float *pfVar3;
  
  piVar2 = (integral_image *)malloc(0x20);
  piVar2->width = width;
  piVar2->height = height;
  iVar1 = width + 0x100;
  piVar2->data_width = iVar1;
  piVar2->data_height = height + 0x100;
  pfVar3 = (float *)malloc((long)((height + 0x100) * iVar1) << 2);
  piVar2->padded_data = pfVar3;
  piVar2->data = pfVar3 + (long)(iVar1 * 0x80) + 0x80;
  return piVar2;
}

Assistant:

struct integral_image *create_padded_integral_img(int width, int height) {
    
    // Allocating memory to integral image that is returned
    struct integral_image *iimage = (struct integral_image *)malloc(sizeof(struct integral_image));

    // Border + 1 because A, B and C are always exclusive.
    int border = PADDING_SIZE;

    // Getting data width  (width of padded image)
    // Border as padding to the left and right because of Dxx.
    int data_width = width + border * 2;

    // Getting data height (height of padded image)
    // Border as padding above and below the image because of Dyy.
    int data_height = height + border * 2;
    
    // Setting real image width and height
    iimage->width = width;
    iimage->height = height;
    
    // Setting data width and height (width and height of padded image)
    iimage->data_width = data_width;
    iimage->data_height = data_height;

    // Allocating data for storing values of integral image with padding
    iimage->padded_data = (float *)malloc(data_width * data_height * sizeof(float));
    
    // Setting data and padded data to be inner offset and origin of original image
    iimage->data = iimage->padded_data + (border * data_width) + border;

    return iimage;
    
}